

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::mousePressEvent(QDateTimeEdit *this,QMouseEvent *event)

{
  uint *puVar1;
  QDateTimeEditPrivate *this_00;
  QWidget *this_01;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((this_00->calendarPopup == true) &&
     (((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x3f00) != 0)) {
    uVar2 = QEventPoint::position();
    auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar7 = minpd(_DAT_0066f5d0,auVar7);
    auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
    auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
    uVar3 = movmskpd(uVar2,auVar6);
    uVar5 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
    }
    uVar4 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar4 = (ulong)(uint)(int)auVar7._8_8_;
    }
    local_28 = (QPoint)(uVar4 | uVar5);
    QAbstractSpinBoxPrivate::updateHoverControl(&this_00->super_QAbstractSpinBoxPrivate,&local_28);
    if ((this_00->super_QAbstractSpinBoxPrivate).hoverControl == SC_ComboBoxArrow) {
      event[0xc] = (QMouseEvent)0x1;
      if (((this_00->super_QAbstractSpinBoxPrivate).field_0x3d0 & 2) == 0) {
        if (this_00->arrowState != State_Sunken) {
          this_01 = *(QWidget **)
                     &(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
          this_00->arrowState = State_Sunken;
          puVar1 = &(this_00->super_QAbstractSpinBoxPrivate).buttonState;
          *(byte *)puVar1 = (byte)*puVar1 | 2;
          QWidget::update(this_01);
        }
        QDateTimeEditPrivate::initCalendarPopup(this_00,(QCalendarWidget *)0x0);
        QDateTimeEditPrivate::positionCalendarPopup(this_00);
        QWidget::show(&this_00->monthCalendar->super_QWidget);
      }
    }
    else {
      QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)this,event);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::mousePressEvent(QMouseEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::mousePressEvent(event);
        return;
    }
    d->updateHoverControl(event->position().toPoint());
    if (d->hoverControl == QStyle::SC_ComboBoxArrow) {
        event->accept();
        if (d->readOnly) {
            return;
        }
        d->updateArrow(QStyle::State_Sunken);
        d->initCalendarPopup();
        d->positionCalendarPopup();
        //Show the calendar
        d->monthCalendar->show();
    } else {
        QAbstractSpinBox::mousePressEvent(event);
    }
}